

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  stbi_uc sVar6;
  byte bVar7;
  byte bVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  stbi_uc sVar12;
  stbi_uc sVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  stbi_uc *__s;
  stbi_uc *__s_00;
  stbi_uc *psVar19;
  byte bVar20;
  undefined4 in_register_0000000c;
  ulong uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint n;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  size_t __size;
  size_t __size_00;
  stbi_uc (*pal) [4];
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar22 = stbi__gif_header(s,g,comp,0);
    if (iVar22 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar22 = g->w;
    iVar17 = g->h;
    iVar23 = stbi__mad3sizes_valid(4,iVar22,iVar17,0);
    if (iVar23 == 0) {
      stbi__g_failure_reason = "too large";
      return (stbi_uc *)0x0;
    }
    iVar17 = iVar17 * iVar22;
    __size = (size_t)(iVar17 * 4);
    __s = (stbi_uc *)malloc(__size);
    g->out = __s;
    __s_00 = (stbi_uc *)malloc(__size);
    g->background = __s_00;
    __size_00 = (size_t)iVar17;
    psVar19 = (stbi_uc *)malloc(__size_00);
    g->history = psVar19;
    if (__s == (stbi_uc *)0x0) {
      stbi__g_failure_reason = "outofmem";
      return (stbi_uc *)0x0;
    }
    if (psVar19 == (stbi_uc *)0x0 || __s_00 == (stbi_uc *)0x0) {
      stbi__g_failure_reason = "outofmem";
      return (stbi_uc *)0x0;
    }
    memset(__s,0,__size);
    memset(__s_00,0,__size);
    memset(psVar19,0,__size_00);
  }
  else {
    uVar27 = (uint)g->eflags >> 2 & 7;
    uVar16 = g->h * g->w;
    uVar29 = 2;
    if (uVar27 != 3) {
      uVar29 = uVar27;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar29 = uVar27;
    }
    if (uVar29 == 3) {
      if (0 < (int)uVar16) {
        uVar21 = 0;
        do {
          if (g->history[uVar21] != '\0') {
            *(undefined4 *)(g->out + uVar21 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar21 * 4);
          }
          uVar21 = uVar21 + 1;
        } while (uVar16 != uVar21);
      }
    }
    else if ((uVar29 == 2) && (0 < (int)uVar16)) {
      uVar21 = 0;
      do {
        if (g->history[uVar21] != '\0') {
          *(undefined4 *)(g->out + uVar21 * 4) = *(undefined4 *)(g->background + uVar21 * 4);
        }
        uVar21 = uVar21 + 1;
      } while (uVar16 != uVar21);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar19 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar19,0,__size_00);
  pal = g->pal;
  while (sVar6 = stbi__get8(s), sVar6 == '!') {
    sVar6 = stbi__get8(s);
    if (sVar6 == 0xf9) {
      bVar7 = stbi__get8(s);
      if (bVar7 == 4) {
        bVar7 = stbi__get8(s);
        g->eflags = (uint)bVar7;
        bVar7 = stbi__get8(s);
        bVar8 = stbi__get8(s);
        g->delay = ((uint)bVar8 * 0x200 + (uint)bVar7 * 2) * 5;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) != 0) {
          bVar7 = stbi__get8(s);
          g->transparent = (uint)bVar7;
          g->pal[bVar7][3] = '\0';
          goto LAB_0017baa9;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
          psVar19 = s->img_buffer;
LAB_0017ba8a:
          s->img_buffer = psVar19 + 1;
        }
        else {
          psVar19 = s->img_buffer;
          iVar22 = (int)s->img_buffer_end - (int)psVar19;
          if (0 < iVar22) goto LAB_0017ba8a;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,1 - iVar22);
        }
        g->transparent = -1;
        goto LAB_0017baa9;
      }
      stbi__skip(s,(uint)bVar7);
    }
    else {
LAB_0017baa9:
      while (bVar7 = stbi__get8(s), bVar7 != 0) {
        stbi__skip(s,(uint)bVar7);
      }
    }
  }
  if (sVar6 == ';') {
    return (stbi_uc *)s;
  }
  if (sVar6 != ',') {
    stbi__g_failure_reason = "unknown code";
    return (stbi_uc *)0x0;
  }
  sVar6 = stbi__get8(s);
  sVar9 = stbi__get8(s);
  sVar10 = stbi__get8(s);
  sVar11 = stbi__get8(s);
  sVar12 = stbi__get8(s);
  sVar13 = stbi__get8(s);
  sVar14 = stbi__get8(s);
  sVar15 = stbi__get8(s);
  iVar22 = (uint)CONCAT11(sVar13,sVar12) + (uint)CONCAT11(sVar9,sVar6);
  if (g->w < iVar22) {
    stbi__g_failure_reason = "bad Image Descriptor";
    return (stbi_uc *)0x0;
  }
  iVar17 = (uint)CONCAT11(sVar15,sVar14) + (uint)CONCAT11(sVar11,sVar10);
  if (g->h < iVar17) {
    stbi__g_failure_reason = "bad Image Descriptor";
    return (stbi_uc *)0x0;
  }
  iVar23 = g->w * 4;
  g->line_size = iVar23;
  iVar26 = (uint)CONCAT11(sVar9,sVar6) << 2;
  g->start_x = iVar26;
  iVar28 = (uint)CONCAT11(sVar11,sVar10) * iVar23;
  g->start_y = iVar28;
  g->max_x = iVar22 * 4;
  iVar17 = iVar17 * iVar23;
  g->max_y = iVar17;
  g->cur_x = iVar26;
  if (CONCAT11(sVar13,sVar12) != 0) {
    iVar17 = iVar28;
  }
  g->cur_y = iVar17;
  bVar7 = stbi__get8(s);
  g->lflags = (uint)bVar7;
  iVar22 = g->line_size * 8;
  if ((bVar7 & 0x40) == 0) {
    iVar22 = g->line_size;
  }
  g->step = iVar22;
  g->parse = (int)((uint)bVar7 << 0x19) >> 0x1f & 3;
  if ((char)bVar7 < '\0') {
    pal = g->lpal;
    iVar22 = -1;
    if ((g->eflags & 1) != 0) {
      iVar22 = g->transparent;
    }
    stbi__gif_parse_colortable(s,pal,2 << (bVar7 & 7),iVar22);
  }
  else if ((g->flags & 0x80) == 0) {
    stbi__g_failure_reason = "missing color table";
    return (stbi_uc *)0x0;
  }
  g->color_table = *pal;
  bVar7 = stbi__get8(s);
  if (0xc < bVar7) {
    return (stbi_uc *)0x0;
  }
  uVar29 = 1 << (bVar7 & 0x1f);
  uVar21 = 0;
  do {
    g->codes[uVar21].prefix = -1;
    g->codes[uVar21].first = (stbi_uc)uVar21;
    g->codes[uVar21].suffix = (stbi_uc)uVar21;
    uVar21 = uVar21 + 1;
  } while (uVar29 != uVar21);
  uVar30 = (2 << (bVar7 & 0x1f)) - 1;
  n = 0;
  iVar22 = 0;
  uVar16 = 0;
  bVar3 = false;
  uVar27 = uVar29 + 2;
  uVar4 = 0xffffffff;
  iVar17 = bVar7 + 1;
  uVar5 = uVar30;
  while( true ) {
    do {
      for (; uVar18 = uVar5, iVar23 = iVar17, uVar24 = uVar4, uVar25 = uVar27, bVar2 = bVar3,
          iVar17 = iVar22 - iVar23, iVar22 < iVar23; iVar22 = iVar22 + 8) {
        if (n == 0) {
          bVar8 = stbi__get8(s);
          if (bVar8 == 0) goto LAB_0017be85;
          n = (uint)bVar8;
        }
        n = n - 1;
        bVar8 = stbi__get8(s);
        bVar20 = (byte)iVar22;
        uVar16 = uVar16 | (uint)bVar8 << (bVar20 & 0x1f);
        bVar3 = bVar2;
        uVar27 = uVar25;
        uVar4 = uVar24;
        iVar17 = iVar23;
        uVar5 = uVar18;
      }
      uVar27 = (int)uVar16 >> ((byte)iVar23 & 0x1f);
      uVar31 = uVar16 & uVar18;
      iVar22 = iVar17;
      uVar16 = uVar27;
      bVar3 = true;
      uVar27 = uVar29 + 2;
      uVar4 = 0xffffffff;
      iVar17 = bVar7 + 1;
      uVar5 = uVar30;
    } while (uVar31 == uVar29);
    if (uVar31 == uVar29 + 1) break;
    if ((int)uVar25 < (int)uVar31) {
      stbi__g_failure_reason = "illegal code in raster";
      return (stbi_uc *)0x0;
    }
    if (!bVar2) {
      stbi__g_failure_reason = "no clear code";
      return (stbi_uc *)0x0;
    }
    if ((int)uVar24 < 0) {
      if (uVar31 == uVar25) {
        stbi__g_failure_reason = "illegal code in raster";
        return (stbi_uc *)0x0;
      }
    }
    else {
      if (0x1fff < (int)uVar25) {
        stbi__g_failure_reason = "too many codes";
        return (stbi_uc *)0x0;
      }
      g->codes[(int)uVar25].prefix = (stbi__int16)uVar24;
      sVar6 = g->codes[uVar24].first;
      g->codes[(int)uVar25].first = sVar6;
      if (uVar31 != uVar25 + 1) {
        sVar6 = g->codes[(int)uVar31].first;
      }
      g->codes[(int)uVar25].suffix = sVar6;
      uVar25 = uVar25 + 1;
    }
    stbi__out_gif_code(g,(stbi__uint16)uVar31);
    bVar3 = true;
    uVar27 = uVar25;
    uVar4 = uVar31;
    iVar17 = iVar23 + 1;
    uVar5 = ~(-1 << ((byte)(iVar23 + 1) & 0x1f));
    if (0xfff < (int)uVar25 || (uVar25 & uVar18) != 0) {
      iVar17 = iVar23;
      uVar5 = uVar18;
    }
  }
  while( true ) {
    stbi__skip(s,n);
    bVar7 = stbi__get8(s);
    if (bVar7 == 0) break;
    n = (uint)bVar7;
  }
LAB_0017be85:
  psVar19 = g->out;
  if (psVar19 == (stbi_uc *)0x0) {
    return (stbi_uc *)0x0;
  }
  if (psVar1 == (stbi_uc *)0x0) {
    uVar29 = g->h * g->w;
    if (0 < (int)uVar29 && 0 < g->bgindex) {
      uVar21 = 0;
      do {
        if (g->history[uVar21] == '\0') {
          g->pal[g->bgindex][3] = 0xff;
          *(stbi_uc (*) [4])(g->out + uVar21 * 4) = g->pal[g->bgindex];
        }
        uVar21 = uVar21 + 1;
      } while (uVar29 != uVar21);
      return psVar19;
    }
    return psVar19;
  }
  return psVar19;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame. 
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}